

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall upb::generator::Output::Write(Output *this,string_view data)

{
  long lVar1;
  short *psVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_type in_R9;
  FixedMapping replacements;
  string_view s;
  string last_line_prefix;
  string stripped;
  long *local_d0;
  char local_c8 [8];
  long local_c0 [2];
  short *local_b0;
  ulong local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  string local_90;
  undefined1 local_70 [32];
  char local_50 [8];
  long *local_48;
  undefined8 local_40;
  char *local_38;
  
  psVar2 = (short *)data._M_str;
  uVar5 = data._M_len;
  local_a8 = 0;
  local_a0 = 0;
  local_b0 = (short *)&local_a0;
  if ((1 < uVar5) && (*psVar2 == 0x200a)) {
    lVar3 = -1;
    if (uVar5 != 1) {
      lVar1 = 0;
      do {
        lVar3 = lVar1;
        if (*(char *)((long)psVar2 + lVar1 + 1) != ' ') break;
        lVar1 = lVar1 + 1;
        lVar3 = -1;
      } while (uVar5 - 1 != lVar1);
    }
    if (lVar3 != -1) {
      uVar4 = lVar3 + 1U;
      if (uVar5 < lVar3 + 1U) {
        uVar4 = uVar5;
      }
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,psVar2,(long)psVar2 + uVar4);
      std::__cxx11::string::resize((ulong)&local_d0,local_c8[0] + -2);
      local_70[0x10] = '\x01';
      local_70[0x11] = '\0';
      local_70[0x12] = '\0';
      local_70[0x13] = '\0';
      local_70[0x14] = '\0';
      local_70[0x15] = '\0';
      local_70[0x16] = '\0';
      local_70[0x17] = '\0';
      local_70._24_8_ = "\n";
      local_50[0] = local_c8[0];
      local_50[1] = local_c8[1];
      local_50[2] = local_c8[2];
      local_50[3] = local_c8[3];
      local_50[4] = local_c8[4];
      local_50[5] = local_c8[5];
      local_50[6] = local_c8[6];
      local_50[7] = local_c8[7];
      local_48 = local_d0;
      local_40 = 1;
      local_38 = "\n";
      replacements._M_len = in_R9;
      replacements._M_array = (iterator)0x2;
      s._M_str = local_70;
      s._M_len = (long)psVar2 + uVar4;
      local_70._0_8_ = uVar4;
      local_70._8_8_ = psVar2;
      absl::lts_20250127::StrReplaceAll_abi_cxx11_
                (&local_90,(lts_20250127 *)(uVar5 - uVar4),s,replacements);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_a8;
      psVar2 = local_b0;
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
    }
  }
  local_70._0_8_ = uVar5;
  local_70._8_8_ = psVar2;
  absl::lts_20250127::StrAppend(&this->output_,(AlphaNum *)local_70);
  if (local_b0 != (short *)&local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void Write(absl::string_view data) {
    std::string stripped;
    if (absl::StartsWith(data, "\n ")) {
      size_t indent = data.substr(1).find_first_not_of(' ');
      if (indent != absl::string_view::npos) {
        // Remove indentation from all lines.
        auto line_prefix = data.substr(0, indent + 1);
        // The final line has an extra newline and is indented two less, eg.
        //    R"cc(
        //      UPB_INLINE $0 $1_$2(const $1 *msg) {
        //        return $1_has_$2(msg) ? *UPB_PTR_AT(msg, $3, $0) : $4;
        //      }
        //    )cc",
        std::string last_line_prefix = std::string(line_prefix);
        last_line_prefix.resize(last_line_prefix.size() - 2);
        data.remove_prefix(line_prefix.size());
        stripped = absl::StrReplaceAll(
            data, {{line_prefix, "\n"}, {last_line_prefix, "\n"}});
        data = stripped;
      }
    }
    absl::StrAppend(&output_, data);
  }